

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O0

void __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::
NonrecursiveMaximumLikelihoodParameterGeneration
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,int num_order,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,bool use_magic_number,double magic_number)

{
  initializer_list<double> __l;
  bool bVar1;
  int iVar2;
  iterator this_00;
  pointer this_01;
  size_type sVar3;
  byte in_CL;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  int half_window_width;
  int window_width;
  iterator itr;
  value_type *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *this_02;
  const_iterator __position;
  vector<double,_std::allocator<double>_> *this_03;
  allocator_type *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  iterator in_stack_ffffffffffffff68;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  in_stack_ffffffffffffff70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff80;
  undefined1 local_69 [49];
  vector<double,_std::allocator<double>_> *local_38;
  undefined8 local_28;
  byte local_19;
  int local_c;
  
  local_19 = in_CL & 1;
  *in_RDI = &PTR__NonrecursiveMaximumLikelihoodParameterGeneration_0013aaf8;
  *(int *)(in_RDI + 1) = in_ESI;
  this_03 = (vector<double,_std::allocator<double>_> *)(in_RDI + 2);
  local_28 = in_XMM0_Qa;
  local_c = in_ESI;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *(byte *)(in_RDI + 5) = local_19 & 1;
  in_RDI[6] = local_28;
  *(undefined1 *)(in_RDI + 7) = 1;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  if (local_c < 0) {
    *(undefined1 *)(in_RDI + 7) = 0;
  }
  else {
    this_02 = (vector<double,_std::allocator<double>_> *)(in_RDI + 2);
    local_38 = (vector<double,_std::allocator<double>_> *)
               std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
    ::__normal_iterator<std::vector<double,std::allocator<double>>*>
              ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                *)this_02,
               (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                *)in_stack_ffffffffffffff28);
    local_69._1_8_ = 0x3ff0000000000000;
    local_69._9_8_ = local_69 + 1;
    local_69._17_8_ = 1;
    __position._M_current = (vector<double,_std::allocator<double>_> *)local_69;
    std::allocator<double>::allocator((allocator<double> *)0x10b234);
    __l._M_len = (size_type)in_stack_ffffffffffffff70._M_current;
    __l._M_array = in_stack_ffffffffffffff68;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),__l,
               in_stack_ffffffffffffff58);
    this_00 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::insert((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)this_02,__position,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::~vector(this_03);
    std::allocator<double>::~allocator((allocator<double> *)0x10b295);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)this_00._M_current);
    while( true ) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)this_00._M_current);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                          *)this_02,
                         (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                          *)this_00._M_current);
      if (!bVar1) break;
      this_01 = __gnu_cxx::
                __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator->((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                              *)&stack0xffffffffffffff70);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(this_01);
      iVar2 = (int)sVar3;
      if (iVar2 % 2 == 0) {
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator->((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                      *)&stack0xffffffffffffff70);
        std::vector<double,_std::allocator<double>_>::push_back
                  (this_02,(value_type *)this_00._M_current);
      }
      if (*(int *)((long)in_RDI + 0x3c) < iVar2 / 2) {
        *(int *)((long)in_RDI + 0x3c) = iVar2 / 2;
      }
      __gnu_cxx::
      __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator++((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                    *)&stack0xffffffffffffff70);
    }
  }
  return;
}

Assistant:

NonrecursiveMaximumLikelihoodParameterGeneration::
    NonrecursiveMaximumLikelihoodParameterGeneration(
        int num_order,
        const std::vector<std::vector<double> >& window_coefficients,
        bool use_magic_number, double magic_number)
    : num_order_(num_order),
      window_coefficients_(window_coefficients),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      is_valid_(true),
      max_half_window_width_(0) {
  if (num_order < 0) {
    is_valid_ = false;
    return;
  }

  // Insert window coeffients for static components.
  window_coefficients_.insert(window_coefficients_.begin(), {1.0});

  for (std::vector<std::vector<double> >::iterator itr(
           window_coefficients_.begin());
       itr != window_coefficients_.end(); ++itr) {
    const int window_width(static_cast<int>(itr->size()));
    if (0 == window_width % 2) {
      itr->push_back(0.0);
    }
    const int half_window_width(window_width / 2);
    if (max_half_window_width_ < half_window_width) {
      max_half_window_width_ = half_window_width;
    }
  }
}